

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O0

vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
* __thiscall
Gudhi::facets<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
          (vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Gudhi *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range
          )

{
  bool bVar1;
  iterator __first;
  iterator __last;
  reference __x;
  Vertex *v;
  iterator __end0;
  iterator __begin0;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_50 [8];
  Simplex f;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range_local;
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  *facets;
  
  f._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::vector(__return_storage_ptr__);
  __first = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)this);
  __last = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)this);
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<std::_Rb_tree_const_iterator<unsigned_long>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)local_50,
             (_Rb_tree_const_iterator<unsigned_long>)__first._M_node,
             (_Rb_tree_const_iterator<unsigned_long>)__last._M_node);
  __end0 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)this);
  v = (Vertex *)
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 this);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&v);
    if (!bVar1) break;
    __x = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&__end0);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_50,__x);
    std::
    vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
    ::emplace_back<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>&>
              ((vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
                *)__return_storage_ptr__,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_50);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_50,__x);
    std::_Rb_tree_const_iterator<unsigned_long>::operator++(&__end0);
  }
  f._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_50);
  if ((f._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::
    vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Toplex_map::Simplex> facets(const Input_vertex_range& vertex_range) {
  std::vector<Toplex_map::Simplex> facets;
  Toplex_map::Simplex f(vertex_range.begin(), vertex_range.end());
  for (const Toplex_map::Vertex& v : vertex_range) {
    f.erase(v);
    facets.emplace_back(f);
    f.insert(v);
  }
  return facets;
}